

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall
mp::BasicSolver::InitMetaInfoAndOptions
          (BasicSolver *this,CStringRef name,CStringRef long_name,long date,int flags)

{
  SolverOptionManager *this_00;
  char *pcVar1;
  SolverOption *pSVar2;
  tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_> this_01;
  ValueArrayRef values;
  ValueArrayRef values_00;
  _Head_base<0UL,_mp::SolverOption_*,_false> local_80;
  __uniq_ptr_impl<mp::SolverOption,_std::default_delete<mp::SolverOption>_> local_78;
  _Head_base<0UL,_mp::SolverOption_*,_false> local_70;
  _Head_base<0UL,_mp::SolverOption_*,_false> local_68;
  _Head_base<0UL,_mp::SolverOption_*,_false> local_60;
  long local_58;
  undefined8 local_50;
  undefined4 uStack_48;
  undefined8 local_40;
  undefined4 uStack_38;
  
  pcVar1 = (char *)(this->name_)._M_string_length;
  local_58 = date;
  strlen(name.data_);
  std::__cxx11::string::_M_replace((ulong)&this->name_,0,pcVar1,(ulong)name.data_);
  if (long_name.data_ == (char *)0x0) {
    long_name.data_ = name.data_;
  }
  pcVar1 = (char *)(this->long_name_)._M_string_length;
  strlen(long_name.data_);
  std::__cxx11::string::_M_replace((ulong)&this->long_name_,0,pcVar1,(ulong)long_name.data_);
  this->date_ = local_58;
  if ((flags & 4U) != 0) {
    this->multiobj_has_native_ = true;
  }
  std::__cxx11::string::_M_assign((string *)&this->version_);
  pSVar2 = (SolverOption *)operator_new(0xd8);
  SolverOption::SolverOption
            (pSVar2,"tech:version version",
             "Single-word phrase: report version details before solving the problem.",
             (ValueArrayRef)ZEXT816(0),true);
  this_00 = &this->super_SolverOptionManager;
  pSVar2->_vptr_SolverOption = (_func_int **)&PTR__SolverOption_005d4618;
  pSVar2[1]._vptr_SolverOption = (_func_int **)this;
  local_60._M_head_impl = pSVar2;
  SolverOptionManager::AddOption(this_00,(OptionPtr *)&local_60);
  if (local_60._M_head_impl != (SolverOption *)0x0) {
    (*(local_60._M_head_impl)->_vptr_SolverOption[1])();
  }
  local_40 = 0;
  uStack_38 = 0;
  SolverOptionManager::AddStrOption<mp::BasicSolver>
            (this_00,"tech:optionfile optionfile option:file",
             "Name of an AMPL solver option file to read (surrounded by \'single\' or \"double\" quotes if the name contains blanks). Lines that start with # are ignored.  Otherwise, each nonempty line should contain \"name=value\", e.g., \"lim:iter=500\"."
             ,0x4680c2,0,(ValueArrayRef)ZEXT816(0x46467a));
  SolverOptionManager::AddIntOption<mp::BasicSolver,int>
            (this_00,"tech:wantsol wantsol",
             "In a stand-alone invocation (no ``-AMPL`` on the command line), what solution information to write.  Sum of\n\n| 1 - Write ``.sol`` file\n| 2 - Primal variables to stdout\n| 4 - Dual variables to stdout\n| 8 - Suppress solution message."
             ,0x4681d4,0);
  SolverOptionManager::AddIntOption<mp::BasicSolver,int>
            (this_00,"obj:no objno",
             "Objective to optimize:\n\n| 0 - None\n| 1 - First (default, if available)\n| 2 - Second (if available), etc.\n"
             ,0x468248,0);
  pSVar2 = (SolverOption *)operator_new(0xd8);
  SolverOption::SolverOption
            (pSVar2,"tech:outlev_mp outlev_mp","0*/1: whether to print MP model information.",
             (ValueArrayRef)ZEXT816(0),false);
  pSVar2->_vptr_SolverOption = (_func_int **)&PTR__SolverOption_005d46c0;
  pSVar2[1]._vptr_SolverOption = (_func_int **)&this->verbose_;
  local_68._M_head_impl = pSVar2;
  SolverOptionManager::AddOption(this_00,(OptionPtr *)&local_68);
  if (local_68._M_head_impl != (SolverOption *)0x0) {
    (*(local_68._M_head_impl)->_vptr_SolverOption[1])();
  }
  pSVar2 = (SolverOption *)operator_new(0xd8);
  SolverOption::SolverOption
            (pSVar2,"tech:debug debug",
             "0*/1: whether to assist testing & debugging, e.g., by outputting auxiliary information (mostly via suffixes)."
             ,(ValueArrayRef)ZEXT816(0),false);
  pSVar2->_vptr_SolverOption = (_func_int **)&PTR__SolverOption_005d46c0;
  pSVar2[1]._vptr_SolverOption = (_func_int **)&this->debug_;
  local_70._M_head_impl = pSVar2;
  SolverOptionManager::AddOption(this_00,(OptionPtr *)&local_70);
  if (local_70._M_head_impl != (SolverOption *)0x0) {
    (*(local_70._M_head_impl)->_vptr_SolverOption[1])();
  }
  this_01.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       operator_new(0xd8);
  SolverOption::SolverOption
            ((SolverOption *)
             this_01.
             super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
             super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl,
             "sol:report_uncertain report_uncertain_sol",
             "0/1*: whether to report objective value(s) in solve_message when solve_result is \'?\' (unknown)."
             ,(ValueArrayRef)ZEXT816(0),false);
  *(undefined ***)
   this_01.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
   super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl = &PTR__SolverOption_005d46c0;
  ((SolverOption *)
  ((long)this_01.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
         super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xd0))->_vptr_SolverOption
       = (_func_int **)&this->report_uncertain_sol_;
  local_78._M_t.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       this_01.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
       super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl;
  SolverOptionManager::AddOption(this_00,(OptionPtr *)&local_78);
  if ((_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
      local_78._M_t.
      super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
      super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl != (SolverOption *)0x0) {
    (**(code **)(*(long *)local_78._M_t.
                          super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
                          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 8))();
  }
  if ((flags & 2U) != 0) {
    values._8_8_ = 3;
    values.values_ = InitMetaInfoAndOptions::values_multiobj_;
    SolverOptionManager::AddStoredOption<int>
              (this_00,"obj:multi multiobj",
               "Whether to use multi-objective optimization:\n\n.. value-table::\n\nWhen obj:multi>0 and several objectives are present, suffixes .objpriority, .objweight, .objreltol, and .objabstol on the objectives are relevant.  Objectives with greater .objpriority values (integer values) have higher priority.  Objectives with the same .objpriority are weighted by .objweight, according to the option obj:multi:weight.\n\nObjectives with positive .objabstol or .objreltol are allowed to be degraded by lower priority objectives by amounts not exceeding the .objabstol (absolute) and .objreltol (relative) limits.\n\nNote that with solver\'s native handling (when obj:multi=1 and supported), some solvers might have special rules for the tolerances, especially for LP, and not allow quadratic objectives. See the solver documentation."
               ,&this->multiobj_,values);
    values_00._8_8_ = 2;
    values_00.values_ = InitMetaInfoAndOptions::values_multiobjweight_;
    SolverOptionManager::AddStoredOption<int>
              (this_00,"obj:multi:weight multiobjweight obj:multi:weights multiobjweights",
               "How to interpret each objective\'s weight sign:\n\n.. value-table::\n\nWith the 1st option (legacy behaviour), negative .objweight for objective i would make objective i\'s sense the opposite of the model\'s 1st objective. Otherwise, it would make objective i\'s sense the opposite to its sense defined in the model."
               ,&this->multiobj_weight_,values_00);
  }
  SolverOptionManager::AddIntOption<mp::BasicSolver,int>
            (this_00,"tech:timing timing tech:report_times report_times",
             "0*/1/2: Whether to print and return timings for the run, all times are wall times. If set to 1, return the solution times in the problem suffixes \'time_solver\', \'time_setup\' and \'time\', \'time\'= time_solver+time_setup+time_output is a measure of the total time spent in the solver driver. If set to 2, return more granular times, including \'time_read\', \'time_conversion\' and \'time_output\'."
             ,0x4682bc,0);
  if ((flags & 1U) != 0) {
    pSVar2 = (SolverOption *)operator_new(0xd8);
    SolverOption::SolverOption
              (pSVar2,"sol:count countsolutions",
               "0*/1: Whether to count the number of solutions and return it in the ``.nsol`` problem suffix."
               ,(ValueArrayRef)ZEXT816(0),false);
    pSVar2->_vptr_SolverOption = (_func_int **)&PTR__SolverOption_005d46c0;
    pSVar2[1]._vptr_SolverOption = (_func_int **)&this->count_solutions_;
    local_80._M_head_impl = pSVar2;
    SolverOptionManager::AddOption(this_00,(OptionPtr *)&local_80);
    if (local_80._M_head_impl != (SolverOption *)0x0) {
      (*(local_80._M_head_impl)->_vptr_SolverOption[1])();
    }
    local_50 = 0;
    uStack_48 = 0;
    SolverOptionManager::AddStrOption<mp::BasicSolver>
              (this_00,"sol:stub solstub solutionstub",
               "Stub for solution files.  If ``solutionstub`` is specified, found solutions are written to files (``solutionstub & \'1\' & \'.sol\'``) ... (``solutionstub & Current.nsol & \'.sol\'``), where ``Current.nsol`` holds the number of returned solutions.  That is, file names are obtained by appending 1, 2, ... ``Current.nsol`` to ``solutionstub``."
               ,0x46832a,0,(ValueArrayRef)ZEXT816(0x468354));
  }
  return;
}

Assistant:

void BasicSolver::InitMetaInfoAndOptions(
  fmt::CStringRef name, fmt::CStringRef long_name, long date, int flags) {
  name_ = name.c_str();
  long_name_ = (long_name.c_str() ? long_name : name).c_str();
  date_ = date;
  if (flags & MULTIPLE_OBJ_NATIVE)
    multiobj_has_native_ = true;

  version_ = long_name_;

  struct VersionOption : SolverOption {
    BasicSolver& s;
    VersionOption(BasicSolver& s) : SolverOption("tech:version version",
      "Single-word phrase: report version details "
      "before solving the problem.", ValueArrayRef(), true), s(s) {}

    void Write(fmt::Writer& w) { w << ((s.bool_options_ & SHOW_VERSION) != 0); }
    void Parse(const char*&, bool) { s.bool_options_ |= SHOW_VERSION; }
    Option_Type type() {
      return Option_Type::BOOL;
    }
  };
  AddOption(OptionPtr(new VersionOption(*this)));

  AddStrOption(
    "tech:optionfile optionfile option:file",
    "Name of an AMPL solver option file to read "
    "(surrounded by 'single' or "
    "\"double\" quotes if the name contains blanks). "
    "Lines that start with # are ignored.  Otherwise, each nonempty "
    "line should contain \"name=value\", e.g., \"lim:iter=500\".",
    &Solver::GetOptionFile, &Solver::UseOptionFile);


  AddIntOption(
    "tech:wantsol wantsol",
    "In a stand-alone invocation (no ``-AMPL`` on the command line), "
    "what solution information to write.  Sum of\n"
    "\n"
    "| 1 - Write ``.sol`` file\n"
    "| 2 - Primal variables to stdout\n"
    "| 4 - Dual variables to stdout\n"
    "| 8 - Suppress solution message.",
    &Solver::GetWantSol, &Solver::SetWantSol);

  AddIntOption(
    "obj:no objno",
    "Objective to optimize:\n"
    "\n"
    "| 0 - None\n"
    "| 1 - First (default, if available)\n"
    "| 2 - Second (if available), etc.\n",
    &Solver::GetObjNo, &Solver::SetObjNo);

  struct BoolOption : TypedSolverOption<int> {
    bool& value_;
    BoolOption(bool& value, const char* name, const char* description)
      : TypedSolverOption<int>(name, description), value_(value) {}

    void GetValue(fmt::LongLong& value) const { value = value_; }
    void SetValue(fmt::LongLong value) {
      if (value != 0 && value != 1)
        throw InvalidOptionValue(name(), value);
      value_ = value != 0;
    }
  };


  AddOption(OptionPtr(
      new BoolOption(verbose_, "tech:outlev_mp outlev_mp",
                     "0*/1: whether to print MP model information.")));

  AddOption(OptionPtr(new BoolOption(
      debug_, "tech:debug debug",
      "0*/1: whether to assist testing & debugging, e.g., "
      "by outputting auxiliary information (mostly via suffixes).")));

  AddOption(OptionPtr(new BoolOption(
      report_uncertain_sol_, "sol:report_uncertain report_uncertain_sol",
      "0/1*: whether to report objective value(s) in solve_message "
      "when solve_result is '?' (unknown).")));

  static const mp::OptionValueInfo values_multiobj_[] = {
      { "0", "Single objective, see option obj:no (default)", 0},
      { "1", "Multi-objective, solver's native handling if available", 1},
      { "2", "Multi-objective, force emulation", 2}
  };
  if ((flags & MULTIPLE_OBJ) != 0) {
    AddStoredOption(
        "obj:multi multiobj",
        "Whether to use multi-objective optimization:\n"
        "\n.. value-table::\n\n"
        "When obj:multi>0 and several objectives are present, suffixes "
        ".objpriority, .objweight, .objreltol, and .objabstol on the "
        "objectives are relevant.  Objectives with greater .objpriority "
        "values (integer values) have higher priority.  Objectives with "
        "the same .objpriority are weighted by .objweight, "
        "according to the option obj:multi:weight.\n"
        "\n"
        "Objectives "
        "with positive .objabstol or .objreltol are allowed to be "
        "degraded by lower priority objectives by amounts not exceeding "
        "the .objabstol (absolute) and .objreltol (relative) limits.\n"
        "\n"
        "Note that with solver's native handling (when obj:multi=1 and supported), "
        "some solvers might have special rules for the tolerances, especially for LP, "
        "and not allow quadratic objectives. See the solver documentation.",
        multiobj_, values_multiobj_);

    static const mp::OptionValueInfo values_multiobjweight_[] = {
        { "1", "relative to the sense of the 1st objective", 1},
        { "2", "relative to its own sense (default)", 2}
    };
    AddStoredOption(
        "obj:multi:weight multiobjweight obj:multi:weights multiobjweights",
        "How to interpret each objective's weight sign:\n"
        "\n.. value-table::\n\n"
        "With the 1st option (legacy behaviour), negative .objweight "
        "for objective i would make "
        "objective i's sense the opposite of the model's 1st objective. "
        "Otherwise, it would make objective i's sense the opposite to its sense "
        "defined in the model.",
        multiobj_weight_, values_multiobjweight_);
  }

  AddIntOption("tech:timing timing tech:report_times report_times",
    "0*/1/2: Whether to print and return timings for the run, all times are wall "
    "times. If set to 1, return the solution times in the problem suffixes "
    "'time_solver', 'time_setup' and 'time', 'time'= time_solver+time_setup+time_output is a "
    "measure of the total time spent in the solver driver. If set to 2, return "
    "more granular times, including 'time_read', 'time_conversion' and 'time_output'.",
    &Solver::GetTiming, &Solver::SetTiming);

  if ((flags & MULTIPLE_SOL) != 0) {

    AddOption(OptionPtr(new BoolOption(count_solutions_, "sol:count countsolutions",
        "0*/1: Whether to count the number of solutions "
        "and return it in the ``.nsol`` problem suffix.")));

    AddStrOption(
          "sol:stub solstub solutionstub",
          "Stub for solution files.  If ``solutionstub`` is specified, "
          "found solutions are written to files (``solutionstub & '1' & "
          "'.sol'``) ... (``solutionstub & Current.nsol & '.sol'``), where "
          "``Current.nsol`` holds the number of returned solutions.  That is, "
          "file names are obtained by appending 1, 2, ... ``Current.nsol`` to "
          "``solutionstub``.",
          &Solver::GetSolutionStub, &Solver::SetSolutionStub);
  }
}